

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_time.c
# Opt level: O2

void parsetimeunits(void *x,t_float amount,t_symbol *unitname,t_float *unit,int *samps)

{
  char *__s1;
  char cVar1;
  char *__s1_00;
  int iVar2;
  float fVar3;
  t_float tVar4;
  
  __s1_00 = unitname->s_name;
  tVar4 = (t_float)(~-(uint)(0.0 < amount) & 0x3f800000 | (uint)amount & -(uint)(0.0 < amount));
  cVar1 = *__s1_00;
  if (((cVar1 == 'p') && (__s1_00[1] == 'e')) && (__s1_00[2] == 'r')) {
    __s1 = __s1_00 + 3;
    iVar2 = strcmp(__s1,"millisecond");
    if ((iVar2 == 0) || (iVar2 = strcmp(__s1,"msec"), iVar2 == 0)) {
      *samps = 0;
LAB_0018742f:
      fVar3 = 1.0;
LAB_00187437:
      tVar4 = fVar3 / tVar4;
LAB_001873e5:
      *unit = tVar4;
      return;
    }
    if (*__s1 == 'm') {
      if ((__s1_00[4] == 'i') && (__s1_00[5] == 'n')) {
        *samps = 0;
        fVar3 = 60000.0;
        goto LAB_00187437;
      }
    }
    else if (*__s1 == 's') {
      if ((__s1_00[4] == 'e') && (__s1_00[5] == 'c')) {
        *samps = 0;
        fVar3 = 1000.0;
        goto LAB_00187437;
      }
      if ((__s1_00[4] == 'a') && (__s1_00[5] == 'm')) {
        *samps = 1;
        goto LAB_0018742f;
      }
    }
  }
  else {
    iVar2 = strcmp(__s1_00,"millisecond");
    if ((iVar2 == 0) || (iVar2 = strcmp(__s1_00,"msec"), iVar2 == 0)) {
      *samps = 0;
      goto LAB_001873e5;
    }
    if (cVar1 == '\0') {
      pd_error(x,"tempo setting needs time unit (\'sec\', \'samp\', \'permin\', etc.");
      goto LAB_001874a2;
    }
    if (cVar1 == 'm') {
      if ((__s1_00[1] == 'i') && (__s1_00[2] == 'n')) {
        *samps = 0;
        tVar4 = tVar4 * 60000.0;
        goto LAB_001873e5;
      }
    }
    else if (cVar1 == 's') {
      if ((__s1_00[1] == 'e') && (__s1_00[2] == 'c')) {
        *samps = 0;
        tVar4 = tVar4 * 1000.0;
        goto LAB_001873e5;
      }
      if ((__s1_00[1] == 'a') && (__s1_00[2] == 'm')) {
        *samps = 1;
        goto LAB_001873e5;
      }
    }
  }
  pd_error(x,"%s: unknown time unit",__s1_00);
LAB_001874a2:
  *unit = 1.0;
  *samps = 0;
  return;
}

Assistant:

void parsetimeunits(void *x, t_float amount, t_symbol *unitname,
    t_float *unit, int *samps)
{
    const char *s = unitname->s_name;
    if (amount <= 0)
        amount = 1;
    if (s[0] == 'p' && s[1] == 'e' && s[2] == 'r')  /* starts with 'per' */
    {
        const char *s2 = s+3;
        if (!strcmp(s2, "millisecond") || !strcmp(s2, "msec"))  /* msec */
            *samps = 0, *unit = 1./amount;
        else if (!strncmp(s2, "sec", 3))        /* seconds */
            *samps = 0, *unit = 1000./amount;
        else if (!strncmp(s2, "min", 3))        /* minutes */
            *samps = 0, *unit = 60000./amount;
        else if (!strncmp(s2, "sam", 3))        /* samples */
            *samps = 1, *unit = 1./amount;
        else goto fail;
    }
    else
    {
            /* empty string defaults to msec */
        if (!strcmp(s, "millisecond") || !strcmp(s, "msec"))
            *samps = 0, *unit = amount;
        else if (!strncmp(s, "sec", 3))
            *samps = 0, *unit = 1000.*amount;
        else if (!strncmp(s, "min", 3))
            *samps = 0, *unit = 60000.*amount;
        else if (!strncmp(s, "sam", 3))
            *samps = 1, *unit = amount;
        else
        {
        fail:
                /* empty time unit specification defaults to 1 msec for
                back compatibility, since it's possible someone threw a
                float argument to timer which had previously been ignored. */
            if (*s)
                pd_error(x, "%s: unknown time unit", s);
            else pd_error(x,
                "tempo setting needs time unit ('sec', 'samp', 'permin', etc.");
            *unit = 1;
            *samps = 0;
        }
    }
}